

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode add_last_chunk(Curl_easy *data,Curl_creader *reader)

{
  int iVar1;
  char *pcVar2;
  bufq *q;
  size_t len;
  char *ptr;
  int rc;
  size_t n;
  curl_slist *pcStack_38;
  CURLcode result;
  curl_slist *tr;
  curl_slist *trailers;
  chunked_reader *ctx;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  trailers = (curl_slist *)reader->ctx;
  tr = (curl_slist *)0x0;
  ctx = (chunked_reader *)reader;
  reader_local = (Curl_creader *)data;
  if ((data->set).trailer_callback == (curl_trailer_callback)0x0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"http_chunk, added last, empty chunk");
    }
    data_local._4_4_ =
         Curl_bufq_cwrite((bufq *)(trailers + 2),"0\r\n\r\n",5,(size_t *)&stack0xffffffffffffffb8);
  }
  else {
    n._4_4_ = Curl_bufq_cwrite((bufq *)(trailers + 2),"0\r\n",3,(size_t *)&stack0xffffffffffffffb8);
    if (n._4_4_ == CURLE_OK) {
      Curl_set_in_callback((Curl_easy *)reader_local,true);
      iVar1 = (**(code **)&reader_local[0x53].phase)(&tr);
      Curl_set_in_callback((Curl_easy *)reader_local,false);
      if (iVar1 == 0) {
        for (pcStack_38 = tr; pcStack_38 != (curl_slist *)0x0; pcStack_38 = pcStack_38->next) {
          pcVar2 = strchr(pcStack_38->data,0x3a);
          if ((pcVar2 == (char *)0x0) || (pcVar2[1] != ' ')) {
            if (((reader_local != (Curl_creader *)0x0) &&
                ((*(ulong *)((long)&reader_local[0x54].phase + 2) >> 0x1c & 1) != 0)) &&
               ((reader_local[0x99].next == (Curl_creader *)0x0 ||
                (0 < *(int *)&(reader_local[0x99].next)->next)))) {
              Curl_infof((Curl_easy *)reader_local,"Malformatted trailing header, skipping trailer")
              ;
            }
          }
          else {
            q = (bufq *)(trailers + 2);
            pcVar2 = pcStack_38->data;
            len = strlen(pcStack_38->data);
            n._4_4_ = Curl_bufq_cwrite(q,pcVar2,len,(size_t *)&stack0xffffffffffffffb8);
            if (n._4_4_ == CURLE_OK) {
              n._4_4_ = Curl_bufq_cwrite((bufq *)(trailers + 2),"\r\n",2,
                                         (size_t *)&stack0xffffffffffffffb8);
            }
            if (n._4_4_ != CURLE_OK) goto LAB_001584a0;
          }
        }
        n._4_4_ = Curl_bufq_cwrite((bufq *)(trailers + 2),"\r\n",2,
                                   (size_t *)&stack0xffffffffffffffb8);
      }
      else {
        Curl_failf((Curl_easy *)reader_local,"operation aborted by trailing headers callback");
        n._4_4_ = CURLE_ABORTED_BY_CALLBACK;
      }
    }
LAB_001584a0:
    curl_slist_free_all(tr);
    if ((((reader_local != (Curl_creader *)0x0) &&
         ((*(ulong *)((long)&reader_local[0x54].phase + 2) >> 0x1c & 1) != 0)) &&
        ((reader_local[0x99].next == (Curl_creader *)0x0 ||
         (0 < *(int *)&(reader_local[0x99].next)->next)))) && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read((Curl_easy *)reader_local,
                    "http_chunk, added last chunk with trailers from client -> %d",(ulong)n._4_4_);
    }
    data_local._4_4_ = n._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode add_last_chunk(struct Curl_easy *data,
                               struct Curl_creader *reader)
{
  struct chunked_reader *ctx = reader->ctx;
  struct curl_slist *trailers = NULL, *tr;
  CURLcode result;
  size_t n;
  int rc;

  if(!data->set.trailer_callback) {
    CURL_TRC_READ(data, "http_chunk, added last, empty chunk");
    return Curl_bufq_cwrite(&ctx->chunkbuf, STRCONST("0\r\n\r\n"), &n);
  }

  result = Curl_bufq_cwrite(&ctx->chunkbuf, STRCONST("0\r\n"), &n);
  if(result)
    goto out;

  Curl_set_in_callback(data, TRUE);
  rc = data->set.trailer_callback(&trailers, data->set.trailer_data);
  Curl_set_in_callback(data, FALSE);

  if(rc != CURL_TRAILERFUNC_OK) {
    failf(data, "operation aborted by trailing headers callback");
    result = CURLE_ABORTED_BY_CALLBACK;
    goto out;
  }

  for(tr = trailers; tr; tr = tr->next) {
    /* only add correctly formatted trailers */
    char *ptr = strchr(tr->data, ':');
    if(!ptr || *(ptr + 1) != ' ') {
      infof(data, "Malformatted trailing header, skipping trailer");
      continue;
    }

    result = Curl_bufq_cwrite(&ctx->chunkbuf, tr->data,
                              strlen(tr->data), &n);
    if(!result)
      result = Curl_bufq_cwrite(&ctx->chunkbuf, STRCONST("\r\n"), &n);
    if(result)
      goto out;
  }

  result = Curl_bufq_cwrite(&ctx->chunkbuf, STRCONST("\r\n"), &n);

out:
  curl_slist_free_all(trailers);
  CURL_TRC_READ(data, "http_chunk, added last chunk with trailers "
                "from client -> %d", result);
  return result;
}